

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O2

int __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::
solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>>
          (branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double> *this,
          unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
          *reduced_cost,int r_size,int bk_min,int bk_max)

{
  undefined8 uVar1;
  longdouble *plVar2;
  item *piVar3;
  int iVar4;
  size_type sVar5;
  uint uVar6;
  int *piVar7;
  int8_t *piVar8;
  long lVar9;
  value_type *pvVar10;
  __normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item_*,_std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>_>
  _Var11;
  solver_failure *this_00;
  int iVar12;
  long lVar13;
  long lVar14;
  longdouble *plVar15;
  long lVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  
  if (r_size < 4) {
    details::fail_fast("Assertion","r_size >= 4",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/branch-and-bound-solver.hpp"
                       ,"453");
  }
  if (bk_max < bk_min) {
    details::fail_fast("Assertion","bk_min <= bk_max",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/branch-and-bound-solver.hpp"
                       ,"454");
  }
  *(int *)(this + 0x74) = bk_min;
  *(int *)(this + 0x78) = bk_max;
  std::
  vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>
  ::resize((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>
            *)(this + 0x20),(ulong)(uint)r_size);
  iVar4 = shared_subvector::init((shared_subvector *)this,(EVP_PKEY_CTX *)(ulong)(uint)r_size);
  if ((char)iVar4 == '\0') {
    this_00 = (solver_failure *)__cxa_allocate_exception(0x18);
    solver_failure::solver_failure(this_00,no_solver_available);
    __cxa_throw(this_00,&solver_failure::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar5 = shared_subvector::emplace((shared_subvector *)this);
  *(size_type *)(this + 0x70) = sVar5;
  if (sVar5 == 0) {
    if (*(long *)(this + 0x40) != *(long *)(this + 0x38)) {
      *(long *)(this + 0x40) = *(long *)(this + 0x38);
    }
    lVar14 = *(long *)(this + 0x20);
    piVar7 = &((reduced_cost->_M_t).
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
              ._M_head_impl)->f;
    for (lVar13 = 0; (ulong)(uint)r_size * 0x30 - lVar13 != 0; lVar13 = lVar13 + 0x30) {
      *(longdouble *)(lVar14 + lVar13) = ((rc_data *)(piVar7 + -5))->value;
      *(int *)(lVar14 + 0x28 + lVar13) = piVar7[-1];
      iVar4 = *piVar7;
      *(int *)(lVar14 + 0x24 + lVar13) = iVar4;
      iVar12 = -iVar4;
      if (0 < iVar4) {
        iVar12 = iVar4;
      }
      piVar7 = piVar7 + 8;
      *(int *)(lVar14 + 0x20 + lVar13) = iVar12;
      *(undefined4 *)(lVar14 + 0x2c + lVar13) = 0;
    }
    piVar8 = shared_subvector::element_data((shared_subvector *)this,0);
    std::__fill_n_a<signed_char*,unsigned_int,int>(piVar8,*(undefined4 *)(this + 0x18));
    std::
    __sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (*(undefined8 *)(this + 0x20),*(undefined8 *)(this + 0x28));
    lVar14 = *(long *)(this + 0x28);
    lVar13 = *(long *)(this + 0x20);
    piVar7 = (int *)(lVar13 + 0x24);
    lVar9 = (lVar14 - lVar13) / 0x30;
    iVar4 = *(int *)(this + 0x74);
    iVar12 = *(int *)(this + 0x78);
    lVar16 = lVar9;
    while (bVar17 = lVar16 != 0, lVar16 = lVar16 + -1, bVar17) {
      if (*piVar7 < 0) {
        iVar4 = iVar4 + piVar7[-1];
        iVar12 = iVar12 + piVar7[-1];
        *(int *)(this + 0x74) = iVar4;
        *(int *)(this + 0x78) = iVar12;
      }
      piVar7 = piVar7 + 0xc;
    }
    *(unkbyte10 *)(lVar14 + -0x20) = *(unkbyte10 *)(lVar14 + -0x30);
    for (uVar6 = (int)lVar9 - 2; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
      lVar14 = (ulong)uVar6 * 0x30;
      *(longdouble *)(lVar13 + 0x10 + lVar14) =
           *(longdouble *)(lVar13 + lVar14) + *(longdouble *)(lVar13 + 0x40 + lVar14);
    }
    if (iVar12 == iVar4) {
      branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::solve_equality
                ((branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double> *)this);
    }
    else {
      branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double>::solve_inequality
                ((branch_and_bound_solver<baryonyx::itm::minimize_tag,_long_double> *)this);
    }
    lVar14 = *(long *)(this + 0x20);
    iVar4 = 0;
    lVar13 = *(long *)(this + 0x28) - lVar14;
    for (lVar16 = 0; (lVar13 / 0x30 & 0xffffffffU) * 0x30 - lVar16 != 0; lVar16 = lVar16 + 0x30) {
      iVar12 = *(int *)(lVar14 + 0x24 + lVar16);
      pvVar10 = shared_subvector::operator[]((shared_subvector *)this,*(int *)(this + 0x70) + iVar4)
      ;
      lVar14 = *(long *)(this + 0x20);
      iVar4 = iVar4 + 1;
      *(uint *)(lVar14 + 0x2c + lVar16) = (uint)((*pvVar10 == '\0') != 0 < iVar12);
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (*(undefined8 *)(this + 0x20),*(undefined8 *)(this + 0x28));
    _Var11 = std::
             __find_if<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::item>>>,__gnu_cxx::__ops::_Iter_pred<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&)_1_>>
                       (*(undefined8 *)(this + 0x20),*(undefined8 *)(this + 0x28));
    plVar2 = *(longdouble **)(this + 0x20);
    piVar3 = *(item **)(this + 0x28);
    lVar14 = ((long)piVar3 - (long)plVar2) / 0x30;
    piVar7 = &((reduced_cost->_M_t).
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
              ._M_head_impl)->id;
    plVar15 = plVar2;
    while (bVar17 = lVar14 != 0, lVar14 = lVar14 + -1, bVar17) {
      ((rc_data *)(piVar7 + -4))->value = *plVar15;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)((long)plVar15 + 0x24);
      plVar15 = plVar15 + 3;
      auVar18 = vshufps_avx(auVar18,auVar18,0xe1);
      uVar1 = vmovlps_avx(auVar18);
      *(undefined8 *)piVar7 = uVar1;
      piVar7 = piVar7 + 8;
    }
    if (_Var11._M_current == piVar3) {
      uVar6 = -(uint)(*(int *)((long)plVar2 + 0x2c) == 0) | r_size;
    }
    else {
      uVar6 = (int)(((long)_Var11._M_current - (long)plVar2) / 0x30) - 1;
    }
    return uVar6;
  }
  details::fail_fast("Assertion","solution == 0u",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/branch-and-bound-solver.hpp"
                     ,"465");
}

Assistant:

int solve(R& reduced_cost, int r_size, int bk_min, int bk_max)
    {
        bx_assert(r_size >= 4);
        bx_assert(bk_min <= bk_max);

        b_min = bk_min;
        b_max = bk_max;

        items.resize(r_size);
        if (!subvector.init(r_size))
            throw solver_failure(solver_error_tag::no_solver_available);

        solution = subvector.emplace();

        bx_assert(solution == 0u);

        nodes.clear();

        for (int i = 0; i != r_size; ++i) {
            items[i].r = reduced_cost[i].value;
            items[i].variable = reduced_cost[i].id;
            items[i].original_factor = reduced_cost[i].f;
            items[i].factor = std::abs(reduced_cost[i].f);
            items[i].result = 0;
        }

        std::fill_n(
          subvector.element_data(solution), subvector.element_size(), 0);

        std::sort(std::begin(items), std::end(items));

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            if (items[i].original_factor < 0) {
                b_min += items[i].factor;
                b_max += items[i].factor;
            }
        }

        // Compute the inversion of the sum z
        items.back().sum_z = items.back().r;
        for (int i = length(items) - 2; i >= 0; --i)
            items[i].sum_z = items[i + 1].sum_z + items[i].r;

        if (b_max == b_min)
            solve_equality();
        else
            solve_inequality();

        for (int i = 0, e = length(items); i != e; ++i) {
            if (items[i].original_factor > 0)
                items[i].result = subvector[solution + i] == 0 ? 0 : 1;
            else
                items[i].result = subvector[solution + i] == 0 ? 1 : 0;
        }

        std::sort(std::begin(items),
                  std::end(items),
                  [](const auto& lhs, const auto& rhs) {
                      if (lhs.result == rhs.result) {
                          if constexpr (std::is_same_v<Mode, minimize_tag>)
                              return lhs.r < rhs.r;
                          else
                              return lhs.r > rhs.r;
                      } else
                          return lhs.result > rhs.result;
                  });

        auto middle =
          std::find_if(std::begin(items),
                       std::end(items),
                       [](const auto& item) { return item.result == 0; });

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            reduced_cost[i].value = items[i].r;
            reduced_cost[i].id = items[i].variable;
            reduced_cost[i].f = items[i].original_factor;
        }

        if (middle == std::end(items))
            return items[0].result == 0 ? -1 : r_size;

        return static_cast<int>(std::distance(std::begin(items), middle) - 1);
    }